

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O2

void __thiscall cmMakefile::RecordPolicies(cmMakefile *this,PolicyMap *pm)

{
  PolicyStatus status;
  PolicyID pid;
  PolicyID id;
  
  for (id = CMP0000; id != CMPCOUNT; id = id + CMP0001) {
    status = GetPolicyStatus(this,id);
    cmPolicies::PolicyMap::Set(pm,id,status);
  }
  return;
}

Assistant:

void cmMakefile::RecordPolicies(cmPolicies::PolicyMap& pm)
{
  /* Record the setting of every policy.  */
  typedef cmPolicies::PolicyID PolicyID;
  for(PolicyID pid = cmPolicies::CMP0000;
      pid != cmPolicies::CMPCOUNT; pid = PolicyID(pid+1))
    {
    pm.Set(pid, this->GetPolicyStatus(pid));
    }
}